

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta)

{
  float *pfVar1;
  float fVar2;
  _Head_base<0UL,_float_*,_false> _Var3;
  _Head_base<0UL,_int_*,_false> _Var4;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  float *pfVar5;
  undefined8 uVar6;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> _Var7;
  bool bVar8;
  uint uVar9;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
  _Var10;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
  _Var11;
  rc_data *prVar12;
  undefined8 extraout_RAX;
  int iVar13;
  ulong uVar14;
  int iVar15;
  _Head_base<0UL,_int_*,_false> _Var16;
  long lVar17;
  int *piVar18;
  type it;
  long lVar19;
  ulong uVar20;
  long lVar21;
  rc_data *ret;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  double dVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 in_register_00001304 [12];
  int local_ac;
  undefined1 local_88 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_78;
  solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
  *local_70;
  float local_64;
  solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
  *local_60;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_58;
  int *local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current != last._M_current) {
    local_60 = this + 8;
    fVar25 = kappa / (1.0 - kappa);
    local_70 = (solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                *)this;
    local_64 = theta;
    local_58._M_head_impl = (col_value *)last._M_current;
    do {
      _Var16._M_head_impl = (int *)(long)*first._M_current;
      if (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
            *)this)->m <= *first._M_current) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ();
        goto LAB_00166161;
      }
      local_50 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_88,(int)local_60);
      uVar20 = 0;
      local_ac = 0;
      local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)_Var16._M_head_impl;
      if (local_88._8_8_ != local_88._0_8_) {
        _Var3._M_head_impl =
             (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                *)this)->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
        _Var16._M_head_impl = (int *)local_88._8_8_;
        do {
          iVar15 = *_Var16._M_head_impl;
          _Var16._M_head_impl = _Var16._M_head_impl + 8;
          _Var3._M_head_impl[iVar15] = local_64 * _Var3._M_head_impl[iVar15];
        } while (_Var16._M_head_impl != (int *)local_88._0_8_);
        uVar20 = 0;
        if (local_88._8_8_ != local_88._0_8_) {
          uVar9 = 1;
          uVar20 = 0;
          _Var16._M_head_impl = (int *)local_88._8_8_;
          do {
            uVar14 = uVar20;
            uVar22 = (ulong)uVar9;
            sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)local_60);
            _Var4._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl
                == (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              auVar27 = ZEXT864(0);
            }
            else {
              auVar27 = ZEXT864(0);
              do {
                iVar15 = *local_38._M_head_impl;
                local_38._M_head_impl = local_38._M_head_impl + 2;
                auVar28._0_4_ = (float)_Var4._M_head_impl[iVar15];
                auVar28._4_12_ = in_register_00001304;
                auVar28 = vfmadd231ss_fma(auVar27._0_16_,auVar28,
                                          ZEXT416((uint)(((
                                                  solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                                                  *)this)->P)._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl[iVar15]));
                auVar27 = ZEXT1664(auVar28);
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_38._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
            }
            _Var11._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var11._M_head_impl[uVar14].id = (int)uVar14;
            iVar15 = *_Var16._M_head_impl;
            _Var16._M_head_impl = _Var16._M_head_impl + 2;
            _Var11._M_head_impl[uVar14].a = _Var4._M_head_impl[iVar15];
            uVar9 = uVar9 + 1;
            _Var11._M_head_impl[uVar14].value =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                    *)this)->c->linear_elements)._M_t.
                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl[*(int *)(local_88._8_8_ + 4)] -
                 auVar27._0_4_;
            uVar20 = uVar14 + 1;
          } while (_Var16._M_head_impl != (int *)local_88._0_8_);
          if (uVar14 != 0) {
            __g = ((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var11._M_head_impl,_Var11._M_head_impl + (uVar20 & 0xffffffff),
                       (int)LZCOUNT(uVar20 & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var11._M_head_impl,_Var11._M_head_impl + (uVar20 & 0xffffffff));
            prVar12 = _Var11._M_head_impl + 1;
            lVar17 = uVar22 * 0xc + -0xc;
            do {
              if (((_Var11._M_head_impl)->value != prVar12->value) ||
                 (NAN((_Var11._M_head_impl)->value) || NAN(prVar12->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var11._M_head_impl,prVar12,__g);
                _Var11._M_head_impl = prVar12;
              }
              prVar12 = prVar12 + 1;
              lVar17 = lVar17 + -0xc;
            } while (lVar17 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var11._M_head_impl,prVar12,__g);
          }
        }
      }
      _Var7._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)local_78;
      _Var10._M_head_impl =
           (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
           ._M_head_impl;
      iVar15 = (int)uVar20;
      if (_Var10._M_head_impl
          [(long)local_78._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl].min < 1) {
        lVar17 = 0xffffffff;
LAB_00165f5d:
        uVar9 = (uint)lVar17;
        iVar13 = uVar9 + 1;
        if ((iVar13 < iVar15) &&
           (local_ac <=
            _Var10._M_head_impl
            [(long)_Var7._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl].max)) {
          _Var11._M_head_impl =
               (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                  *)this)->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
               ._M_head_impl;
          lVar21 = (long)(int)uVar9 * 0xc;
          lVar23 = (long)(int)uVar9 + 1;
          do {
            lVar17 = lVar23;
            _Var10._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                    *)this)->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
                 ._M_head_impl;
            local_ac = local_ac + *(int *)((long)&_Var11._M_head_impl[1].a + lVar21);
            if (local_ac <
                _Var10._M_head_impl
                [(long)_Var7._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl].min) {
              piVar18 = (int *)(local_88._8_8_ +
                               (long)*(int *)((long)&_Var11._M_head_impl[1].id + lVar21) * 2 * 4);
LAB_00166057:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar18[1]);
              _Var3._M_head_impl =
                   (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
              auVar28 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)((long)((((
                                                  solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                                                  *)this)->R)._M_t.
                                                  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                                                  .
                                                  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
                                                  ._M_head_impl + 1) + lVar21) * 0.5)),
                                        ZEXT416((uint)fVar25),ZEXT416((uint)delta));
              _Var3._M_head_impl[*piVar18] = _Var3._M_head_impl[*piVar18] - auVar28._0_4_;
              break;
            }
            piVar18 = (int *)(local_88._8_8_ +
                             (long)*(int *)((long)&_Var11._M_head_impl[1].id + lVar21) * 2 * 4);
            if (*(int *)((long)(_Var10._M_head_impl +
                               (long)_Var7._M_t.
                                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                     super__Head_base<0UL,_int_*,_false>._M_head_impl) + 4) <
                local_ac) goto LAB_00166057;
            fVar2 = *(float *)((long)&_Var11._M_head_impl[1].value + lVar21);
            bVar8 = fVar2 == 0.0;
            bVar24 = fVar2 < 0.0;
            if ((bVar8) && (!NAN(fVar2))) {
              dVar26 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                                    *)this)->rng);
              bVar8 = dVar26 == 0.5;
              bVar24 = 0.5 < dVar26;
            }
            if (bVar24 || bVar8) goto LAB_00166057;
            bit_array_impl::set(&x->super_bit_array_impl,piVar18[1]);
            _Var11._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var3._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                    *)this)->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                 _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl;
            pfVar1 = (float *)((long)&_Var11._M_head_impl[1].value + lVar21);
            lVar21 = lVar21 + 0xc;
            auVar28 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar1 * 0.5)),ZEXT416((uint)fVar25),
                                      ZEXT416((uint)delta));
            _Var3._M_head_impl[*piVar18] = auVar28._0_4_ + _Var3._M_head_impl[*piVar18];
            lVar23 = lVar17 + 1;
          } while (lVar17 + 1 < (long)iVar15);
          goto LAB_0016609c;
        }
      }
      else {
        _Var11._M_head_impl =
             (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar23 = 0;
        local_ac = 0;
        local_48 = (long)iVar15 + -2;
        lVar21 = -1;
        do {
          uVar6 = local_88._8_8_;
          local_ac = local_ac + *(int *)((long)&(_Var11._M_head_impl)->a + lVar23);
          lVar19 = (long)*(int *)((long)&(_Var11._M_head_impl)->id + lVar23);
          lVar17 = lVar21 + 1;
          iVar13 = (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                      *)this)->b)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
                   .
                   super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
                   ._M_head_impl
                   [(long)_Var7._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl].min;
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_88._8_8_ + (lVar19 * 2 + 1) * 4));
          _Var11._M_head_impl =
               (local_70->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
               ._M_head_impl;
          _Var3._M_head_impl =
               (local_70->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
          auVar28 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)((long)&(_Var11._M_head_impl)->value +
                                                             lVar23) * 0.5)),ZEXT416((uint)fVar25),
                                    ZEXT416((uint)delta));
          _Var3._M_head_impl[*(int *)(uVar6 + lVar19 * 2 * 4)] =
               auVar28._0_4_ + _Var3._M_head_impl[*(int *)(uVar6 + lVar19 * 2 * 4)];
          this = (solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
                  *)local_70;
          if (iVar13 <= local_ac) break;
          lVar23 = lVar23 + 0xc;
          bVar8 = lVar21 < local_48;
          lVar21 = lVar17;
        } while (bVar8);
        _Var10._M_head_impl =
             (local_70->b)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::bound_factor_*,_false>
             ._M_head_impl;
        if (_Var10._M_head_impl
            [(long)_Var7._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl].min <= local_ac)
        goto LAB_00165f5d;
LAB_0016609c:
        uVar9 = (uint)lVar17;
        iVar13 = uVar9 + 1;
      }
      this = (solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
              *)local_70;
      if (iVar13 < iVar15) {
        prVar12 = (local_70->R)._M_t.
                  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
                  ._M_head_impl;
        iVar15 = ~uVar9 + iVar15;
        lVar17 = (long)(int)uVar9 * 0xc;
        do {
          uVar6 = local_88._8_8_;
          lVar21 = (long)*(int *)((long)&prVar12[1].id + lVar17);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_88._8_8_ + (lVar21 * 2 + 1) * 4));
          prVar12 = (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                       *)this)->R)._M_t.
                    super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data[]>_>
                    .
                    super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>::rc_data_*,_false>
                    ._M_head_impl;
          pfVar5 = (((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                      *)this)->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                   _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          pfVar1 = (float *)((long)&prVar12[1].value + lVar17);
          lVar17 = lVar17 + 0xc;
          iVar15 = iVar15 + -1;
          auVar28 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar1 * 0.5)),ZEXT416((uint)fVar25),
                                    ZEXT416((uint)delta));
          pfVar5[*(int *)(uVar6 + lVar21 * 2 * 4)] =
               pfVar5[*(int *)(uVar6 + lVar21 * 2 * 4)] - auVar28._0_4_;
        } while (iVar15 != 0);
      }
      bVar8 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                          *)this,(int)local_78._M_t.
                                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                      super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (!bVar8) {
LAB_00166161:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      first._M_current = local_50 + 1;
    } while ((col_value *)first._M_current != local_58._M_head_impl);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }